

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentDensity.cpp
# Opt level: O1

void __thiscall OpenMD::CurrentDensity::process(CurrentDensity *this)

{
  vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *this_00;
  long *plVar1;
  char cVar2;
  SimInfo *info;
  pointer pvVar3;
  long lVar4;
  iterator __position;
  iterator __position_00;
  StuntDouble *pSVar5;
  AtomType *pAVar6;
  pointer pdVar7;
  RealType RVar8;
  SelectionManager *this_01;
  bool bVar9;
  int iVar10;
  SelectionSet *pSVar11;
  pointer ppSVar12;
  uint i;
  double *__args;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  Vector3d pos;
  int ii;
  FixedChargeAdapter fca;
  StuntDouble *sd;
  FluctuatingChargeAdapter fqa;
  Vector3d COMvel;
  Mat3x3d hmat;
  DumpReader reader;
  SelectionSet local_1378;
  int local_1358;
  int local_1354;
  RealType local_1350;
  double local_1348;
  double local_1340;
  FixedChargeAdapter local_1338;
  StuntDouble *local_1330;
  vector<double,std::allocator<double>> *local_1328;
  SelectionEvaluator *local_1320;
  SelectionManager *local_1318;
  Thermo *local_1310;
  ulong local_1308;
  double local_1300;
  ulong local_12f8;
  FluctuatingChargeAdapter local_12f0;
  Vector3d local_12e8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar10 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar10 / (this->super_StaticAnalyser).step_;
  this->overallCurrentDensity_ = 0.0;
  if (0 < iVar10) {
    local_1310 = &this->thermo_;
    local_1328 = (vector<double,std::allocator<double>> *)&this->zBox_;
    local_1320 = &this->evaluator_;
    local_1318 = &this->seleMan_;
    uVar14 = 0;
    local_1358 = iVar10;
    do {
      this_01 = local_1318;
      local_1308 = uVar14;
      DumpReader::readFrame(&local_1288,(int)uVar14);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      Thermo::getComVel(&local_12e8,local_1310);
      uVar14 = (ulong)(this->super_StaticAnalyser).nBins_;
      if (uVar14 != 0) {
        pvVar3 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = 0;
        do {
          lVar4 = *(long *)((long)&(pvVar3->
                                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                   )._M_impl.super__Vector_impl_data + lVar13);
          if (*(long *)((long)&(pvVar3->
                               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                               )._M_impl.super__Vector_impl_data + lVar13 + 8) != lVar4) {
            *(long *)((long)&(pvVar3->
                             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                             )._M_impl.super__Vector_impl_data + lVar13 + 8) = lVar4;
          }
          lVar13 = lVar13 + 0x18;
        } while (uVar14 * 0x18 != lVar13);
      }
      local_1350 = Snapshot::getVolume(this->currentSnapshot_);
      uVar15 = (this->super_StaticAnalyser).nBins_;
      Snapshot::getHmat(&local_12d0,this->currentSnapshot_);
      __args = (double *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)this->axis_ * 0x20);
      __position._M_current =
           (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_1328,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1378,local_1320);
        lVar13 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar13),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1378.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar13));
          lVar13 = lVar13 + 0x28;
        } while (lVar13 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1378.bitsets_);
      }
      local_1330 = SelectionManager::beginSelected(this_01,&local_1354);
      local_1300 = local_1350 / (double)uVar15;
      while (local_1330 != (StuntDouble *)0x0) {
        pSVar11 = (SelectionSet *)
                  ((long)local_1330->localIndex_ * 0x18 +
                  *(long *)((long)&(local_1330->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_1330->storage_)
                  );
        local_1378.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pSVar11 != &local_1378) {
          lVar13 = 0;
          do {
            (&local_1378.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar13] =
                 (&(pSVar11->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
        }
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1378);
          uVar15 = (this->super_StaticAnalyser).nBins_;
          this_00 = (vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)
                    ((this->sliceSDLists_).
                     super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                    (int)((uint)(int)(((double)(&local_1378.bitsets_.
                                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)
                                               [(uint)this->axis_] /
                                       *(double *)
                                        ((long)local_12d0.super_SquareMatrix<double,_3>.
                                               super_RectMatrix<double,_3U,_3U>.data_ +
                                        (ulong)(uint)this->axis_ * 0x20) + 0.5) * (double)uVar15) %
                         uVar15));
          __position_00._M_current = *(StuntDouble ***)(this_00 + 8);
          if (__position_00._M_current == *(StuntDouble ***)(this_00 + 0x10)) {
            std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
            _M_realloc_insert<OpenMD::StuntDouble*const&>(this_00,__position_00,&local_1330);
          }
          else {
            *__position_00._M_current = local_1330;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
        local_1330 = SelectionManager::nextSelected(this_01,&local_1354);
      }
      local_1330 = (StuntDouble *)0x0;
      if ((this->super_StaticAnalyser).nBins_ != 0) {
        uVar14 = 0;
        do {
          pvVar3 = (this->sliceSDLists_).
                   super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppSVar12 = pvVar3[uVar14].
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_12f8 = uVar14;
          if (*(pointer *)
               ((long)&pvVar3[uVar14].
                       super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                       ._M_impl.super__Vector_impl_data + 8) == ppSVar12) {
            dVar19 = 0.0;
          }
          else {
            dVar19 = 0.0;
            uVar15 = 1;
            uVar16 = 0;
            do {
              pSVar5 = ppSVar12[uVar16];
              if (pSVar5->objType_ < otRigidBody) {
                pAVar6 = (AtomType *)pSVar5[1]._vptr_StuntDouble;
                local_1340 = dVar19;
                local_1338.at_ = pAVar6;
                bVar9 = FixedChargeAdapter::isFixedCharge(&local_1338);
                uVar17 = 0;
                uVar18 = 0;
                if (bVar9) {
                  RVar8 = FixedChargeAdapter::getCharge(&local_1338);
                  uVar17 = SUB84(RVar8,0);
                  uVar18 = (undefined4)((ulong)RVar8 >> 0x20);
                }
                local_1348 = (double)CONCAT44(uVar18,uVar17);
                local_12f0.at_ = pAVar6;
                bVar9 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_12f0);
                dVar19 = local_1348;
                if (bVar9) {
                  dVar19 = local_1348 +
                           *(double *)
                            (*(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).
                                              flucQPos.
                                              super__Vector_base<double,_std::allocator<double>_> +
                                      pSVar5->storage_) + (long)pSVar5->localIndex_ * 8);
                }
                lVar13 = *(long *)(*(long *)&(this->sliceSDLists_).
                                             super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                             ._M_impl.super__Vector_impl_data + uVar16 * 8);
                lVar4 = *(long *)(*(long *)(*(long *)(lVar13 + 0x18) + 0x18) + 0x18 +
                                 *(long *)(lVar13 + 0x10));
                local_1378.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     *(pointer *)(lVar4 + 0x10 + (long)*(int *)(lVar13 + 0x30) * 0x18);
                plVar1 = (long *)(lVar4 + (long)*(int *)(lVar13 + 0x30) * 0x18);
                local_1378.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                local_1378.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar1[1];
                dVar19 = local_1340 +
                         ((double)(&local_1378.bitsets_.
                                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                    ._M_impl.super__Vector_impl_data._M_start)[(uint)this->axis_] -
                         local_12e8.super_Vector<double,_3U>.data_[(uint)this->axis_]) * dVar19;
              }
              uVar16 = (ulong)uVar15;
              pvVar3 = (this->sliceSDLists_).
                       super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppSVar12 = pvVar3[uVar14].
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              uVar15 = uVar15 + 1;
            } while (uVar16 < (ulong)((long)*(pointer *)
                                             ((long)&pvVar3[uVar14].
                                                                                                          
                                                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                      (long)ppSVar12 >> 3));
          }
          pdVar7 = (this->currentDensity_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar7[local_12f8] = dVar19 / local_1300 + pdVar7[local_12f8];
          this->overallCurrentDensity_ = dVar19 / local_1350 + this->overallCurrentDensity_;
          uVar14 = local_12f8 + 1;
        } while (uVar14 < (this->super_StaticAnalyser).nBins_);
      }
      uVar15 = (int)local_1308 + (this->super_StaticAnalyser).step_;
      uVar14 = (ulong)uVar15;
    } while ((int)uVar15 < local_1358);
  }
  writeCurrentDensity(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void CurrentDensity::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames            = reader.getNFrames();
    nProcessed_            = nFrames / step_;
    overallCurrentDensity_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
      Vector3d COMvel  = thermo_.getComVel();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      RealType boxVolume   = currentSnapshot_->getVolume();
      RealType sliceVolume = boxVolume / nBins_;
      Mat3x3d hmat         = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        int binNo;
        Vector3d pos = sd->getPos();

        if (usePeriodicBoundaryConditions_) {
          currentSnapshot_->wrapVector(pos);
          binNo =
              int(nBins_ * (pos[axis_] / hmat(axis_, axis_) + 0.5)) % nBins_;
          sliceSDLists_[binNo].push_back(sd);
        }
      }

      // loop over the slices to calculate the densities
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType binJc = 0;

        for (unsigned int j = 0; j < sliceSDLists_[i].size(); ++j) {
          RealType q = 0.0;
          Atom* atom = static_cast<Atom*>(sliceSDLists_[i][j]);

          AtomType* atomType = atom->getAtomType();

          if (sliceSDLists_[i][j]->isAtom()) {
            FixedChargeAdapter fca = FixedChargeAdapter(atomType);
            if (fca.isFixedCharge()) q = fca.getCharge();

            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) q += atom->getFlucQPos();

            Vector3d vel = sliceSDLists_[i][j]->getVel();
            binJc += q * (vel[axis_] - COMvel[axis_]);
          }
        }

        // Units of (e / Ang^2 / fs)
        currentDensity_[i] += binJc / sliceVolume;
        overallCurrentDensity_ += binJc / boxVolume;
      }
    }

    writeCurrentDensity();
  }